

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_12,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_3> *pVVar1;
  Vector<float,_4> *pVVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  Vector<float,_3> *pVVar8;
  int col;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in1;
  Mat4x3 m;
  float afStack_c8 [6];
  float local_b0 [2];
  undefined8 local_a8;
  undefined4 local_a0;
  Matrix<float,_4,_3> local_98;
  Matrix<float,_3,_4> local_68;
  Matrix<float,_3,_3> local_2c;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar3 = (float *)&local_68;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar7) = uVar12;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar3 = pfVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_68.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_68.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_68.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar1 = (Vector<float,_3> *)&local_68;
    local_68.m_data.m_data[2].m_data[2] = 0.0;
    local_68.m_data.m_data[3].m_data[0] = 0.0;
    local_68.m_data.m_data[3].m_data[1] = 0.0;
    local_68.m_data.m_data[3].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pVVar8 = pVVar1;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar8->m_data)->m_data[0].m_data[0] =
             (float)puVar5[lVar6];
        lVar6 = lVar6 + 1;
        pVVar8 = pVVar8 + 1;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      pVVar1 = (Vector<float,_3> *)(pVVar1->m_data + 1);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar2 = local_98.m_data.m_data + 1;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar9 = _DAT_00ac4b30;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar2 + -1))->m_data[0].m_data + lVar7) =
               uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar4 + -0x10 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pVVar2->m_data + lVar7) = uVar12;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      pVVar2 = (Vector<float,_4> *)(pVVar2->m_data + 1);
    } while (lVar6 != 4);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_98.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_98.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar3 = (float *)&local_98;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[3] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[3] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[0].m_data[3] = 0.0;
    puVar5 = &DAT_00b1f9d0;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar3[lVar6] = (float)*(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  tcu::operator*(&local_2c,&local_68,&local_98);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  lVar4 = 0;
  do {
    local_b0[lVar4] =
         local_2c.m_data.m_data[0].m_data[lVar4] + local_2c.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  afStack_c8[4] = 0.0;
  afStack_c8[2] = 0.0;
  afStack_c8[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_c8[lVar4 + 2] = local_b0[lVar4] + local_2c.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar4]] = afStack_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}